

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_equals(roaring_bitmap_t *r1,roaring_bitmap_t *r2)

{
  uint uVar1;
  void **ppvVar2;
  uint8_t *puVar3;
  void **ppvVar4;
  uint8_t *puVar5;
  _Bool _Var6;
  array_container_t *container1;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  size_t n;
  ulong uVar10;
  array_container_t *container1_00;
  uint64_t *s2;
  array_container_t *paVar11;
  uint64_t *s1;
  
  uVar1 = (r1->high_low_container).size;
  uVar10 = (ulong)uVar1;
  if (uVar1 == (r2->high_low_container).size) {
    if ((int)uVar1 < 1) {
      _Var6 = true;
    }
    else {
      uVar9 = 0;
      do {
        if ((r1->high_low_container).keys[uVar9] != (r2->high_low_container).keys[uVar9])
        goto LAB_0011a535;
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
      ppvVar2 = (r1->high_low_container).containers;
      puVar3 = (r1->high_low_container).typecodes;
      ppvVar4 = (r2->high_low_container).containers;
      puVar5 = (r2->high_low_container).typecodes;
      uVar9 = 0;
      do {
        container1 = (array_container_t *)ppvVar2[uVar9];
        bVar7 = puVar3[uVar9];
        container1_00 = (array_container_t *)ppvVar4[uVar9];
        bVar8 = puVar5[uVar9];
        if (bVar7 == 4) {
          bVar7 = *(byte *)&container1->array;
          if (bVar7 == 4) goto LAB_0011a54a;
          container1 = *(array_container_t **)container1;
        }
        if (bVar8 == 4) {
          bVar8 = *(byte *)&container1_00->array;
          if (bVar8 == 4) {
LAB_0011a54a:
            __assert_fail("*type != SHARED_CONTAINER_TYPE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1062,
                          "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                         );
          }
          container1_00 = *(array_container_t **)container1_00;
        }
        switch((uint)bVar8 + (uint)bVar7 * 4) {
        case 5:
          _Var6 = bitset_container_equals
                            ((bitset_container_t *)container1,(bitset_container_t *)container1_00);
          goto LAB_0011a51d;
        case 6:
          paVar11 = container1;
          break;
        case 7:
          paVar11 = container1;
          goto LAB_0011a518;
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x12a0,
                        "_Bool container_equals(const container_t *, uint8_t, const container_t *, uint8_t)"
                       );
        case 9:
          paVar11 = container1_00;
          container1_00 = container1;
          break;
        case 10:
          if (container1->cardinality == container1_00->cardinality) {
            s1 = (uint64_t *)container1->array;
            s2 = (uint64_t *)container1_00->array;
            n = (long)container1->cardinality * 2;
            goto LAB_0011a4e2;
          }
          goto LAB_0011a535;
        case 0xb:
          paVar11 = container1;
          goto LAB_0011a4fc;
        case 0xd:
          paVar11 = container1_00;
          container1_00 = container1;
LAB_0011a518:
          _Var6 = run_container_equals_bitset
                            ((run_container_t *)container1_00,(bitset_container_t *)paVar11);
          goto LAB_0011a51d;
        case 0xe:
          paVar11 = container1_00;
          container1_00 = container1;
LAB_0011a4fc:
          _Var6 = run_container_equals_array((run_container_t *)container1_00,paVar11);
          goto LAB_0011a51d;
        case 0xf:
          if (container1->cardinality == container1_00->cardinality) {
            s1 = (uint64_t *)container1->array;
            s2 = (uint64_t *)container1_00->array;
            n = (long)container1->cardinality << 2;
LAB_0011a4e2:
            _Var6 = memequals(s1,s2,n);
            goto LAB_0011a51d;
          }
          goto LAB_0011a535;
        }
        _Var6 = array_container_equal_bitset(container1_00,(bitset_container_t *)paVar11);
LAB_0011a51d:
        if (_Var6 == false) goto LAB_0011a535;
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
      _Var6 = uVar10 <= uVar9;
    }
  }
  else {
LAB_0011a535:
    _Var6 = false;
  }
  return _Var6;
}

Assistant:

bool roaring_bitmap_equals(const roaring_bitmap_t *r1,
                           const roaring_bitmap_t *r2) {
    const roaring_array_t *ra1 = &r1->high_low_container;
    const roaring_array_t *ra2 = &r2->high_low_container;

    if (ra1->size != ra2->size) {
        return false;
    }
    for (int i = 0; i < ra1->size; ++i) {
        if (ra1->keys[i] != ra2->keys[i]) {
            return false;
        }
    }
    for (int i = 0; i < ra1->size; ++i) {
        bool areequal = container_equals(ra1->containers[i],
                                         ra1->typecodes[i],
                                         ra2->containers[i],
                                         ra2->typecodes[i]);
        if (!areequal) {
            return false;
        }
    }
    return true;
}